

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::StencilRefTestCase::test(StencilRefTestCase *this)

{
  int iVar1;
  uint mask;
  RenderTarget *this_00;
  int local_18;
  int ref;
  int stencilBit;
  int stencilBits;
  StencilRefTestCase *this_local;
  
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (ulong)this->m_testTargetName,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  this_00 = gles2::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  iVar1 = tcu::RenderTarget::getStencilBits(this_00);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    mask = 1 << ((byte)local_18 & 0x1f);
    glu::CallLogWrapper::glStencilFunc(&(this->super_ApiCase).super_CallLogWrapper,0x207,mask,0);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               (ulong)this->m_testTargetName,(ulong)mask);
    ApiCase::expectError(&this->super_ApiCase,0);
    glu::CallLogWrapper::glStencilFunc(&(this->super_ApiCase).super_CallLogWrapper,0x207,mask,mask);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               (ulong)this->m_testTargetName,(ulong)mask);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyInteger(m_testCtx, m_testTargetName, 0);
		expectError(GL_NO_ERROR);

		const int stencilBits = m_context.getRenderTarget().getStencilBits();

		for (int stencilBit = 0; stencilBit < stencilBits; ++stencilBit)
		{
			const int ref = 1 << stencilBit;

			glStencilFunc(GL_ALWAYS, ref, 0); // mask should not affect the REF
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_testTargetName, ref);
			expectError(GL_NO_ERROR);

			glStencilFunc(GL_ALWAYS, ref, ref);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_testTargetName, ref);
			expectError(GL_NO_ERROR);
		}
	}